

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::List<Func*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
Copy<JsUtil::List<Func*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
          (List<Func*,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this,
          List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *list)

{
  void *dst;
  int iVar1;
  uint32 uVar2;
  uint32 uVar3;
  Func **src;
  List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *list_local;
  List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_local;
  
  iVar1 = ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                    (&list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
  if (0 < iVar1) {
    iVar1 = ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                      (&list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>
                      );
    List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray((List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)this,iVar1);
    dst = *(void **)(this + 8);
    uVar2 = UInt32Math::Mul(8,*(uint32 *)(this + 0x20));
    src = ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::GetBuffer
                    (&list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
    uVar3 = ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                      (&list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>
                      );
    uVar3 = UInt32Math::Mul(8,uVar3);
    js_memcpy_s(dst,(ulong)uVar2,src,(ulong)uVar3);
  }
  iVar1 = ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                    (&list->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
  *(int *)(this + 0x10) = iVar1;
  return;
}

Assistant:

void Copy(const U* list)
        {
            CompileAssert(sizeof(TElementType) == sizeof(typename U::TElementType));
            if (list->Count() > 0)
            {
                this->EnsureArray(list->Count());
                js_memcpy_s(this->buffer, UInt32Math::Mul(sizeof(TElementType), this->length), list->GetBuffer(), UInt32Math::Mul(sizeof(TElementType), list->Count()));
            }
            this->count = list->Count();
        }